

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tet_ideal(REF_GRID ref_grid,REF_INT node,REF_INT tet,REF_DBL *ideal_location)

{
  REF_CELL ref_cell_00;
  REF_NODE ref_node_00;
  double dVar1;
  double dVar2;
  double local_2b8;
  double local_2a8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL length_in_metric;
  REF_DBL scale;
  REF_DBL m [6];
  REF_DBL log_m [6];
  REF_DBL log_m3 [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_DBL dn [3];
  int local_124;
  int local_120;
  REF_INT ixyz;
  REF_INT tri_node;
  REF_INT tet_node;
  REF_INT tri_nodes [27];
  REF_INT local_a4;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *ideal_location_local;
  REF_INT tet_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[8];
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,tet,tri_nodes + 0x1a);
  if (ref_grid_local._4_4_ == 0) {
    tri_node = -1;
    tet_node = -1;
    tri_nodes[0] = -1;
    for (ixyz = 0; ixyz < 4; ixyz = ixyz + 1) {
      if (node == tri_nodes[(long)ixyz + 0x1a]) {
        for (local_120 = 0; local_120 < 3; local_120 = local_120 + 1) {
          (&tri_node)[local_120] = tri_nodes[(long)ref_cell_00->f2n[local_120 + ixyz * 4] + 0x1a];
        }
      }
    }
    if (((tri_node == -1) || (tet_node == -1)) || (tri_nodes[0] == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x538,"ref_smooth_tet_ideal","empty tetrahedra face");
      ref_grid_local._4_4_ = 1;
    }
    else {
      for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
        ideal_location[local_124] =
             (ref_node_00->real[local_124 + tri_node * 0xf] +
              ref_node_00->real[local_124 + tet_node * 0xf] +
             ref_node_00->real[local_124 + tri_nodes[0] * 0xf]) / 3.0;
      }
      ref_grid_local._4_4_ = ref_node_tri_normal(ref_node_00,&tri_node,log_m0 + 5);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_math_normalize(log_m0 + 5);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_node_metric_get_log(ref_node_00,tri_nodes[0x1a],log_m1 + 5);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_node_metric_get_log(ref_node_00,local_a4,log_m2 + 5);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_node_metric_get_log(ref_node_00,nodes[0],log_m3 + 5);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = ref_node_metric_get_log(ref_node_00,nodes[1],log_m + 5);
                if (ref_grid_local._4_4_ == 0) {
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 6;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    m[(long)ref_private_macro_code_rss_1 + 5] =
                         (log_m1[(long)ref_private_macro_code_rss_1 + 5] +
                          log_m2[(long)ref_private_macro_code_rss_1 + 5] +
                          log_m3[(long)ref_private_macro_code_rss_1 + 5] +
                         log_m[(long)ref_private_macro_code_rss_1 + 5]) * 0.25;
                  }
                  ref_grid_local._4_4_ = ref_matrix_exp_m(m + 5,&scale);
                  if (ref_grid_local._4_4_ == 0) {
                    dVar1 = sqrt(dn[1] * (m[4] * dn[1] + m[1] * log_m0[5] + m[3] * dn[0]) +
                                 log_m0[5] * (m[1] * dn[1] + scale * log_m0[5] + m[0] * dn[0]) +
                                 dn[0] * (m[3] * dn[1] + m[0] * log_m0[5] + m[2] * dn[0]));
                    dVar2 = sqrt(6.0);
                    dVar2 = dVar2 / 3.0;
                    if (dVar1 * 1e+20 <= 0.0) {
                      local_2a8 = -(dVar1 * 1e+20);
                    }
                    else {
                      local_2a8 = dVar1 * 1e+20;
                    }
                    local_2b8 = dVar2;
                    if (dVar2 <= 0.0) {
                      local_2b8 = -dVar2;
                    }
                    if (local_2a8 <= local_2b8) {
                      printf(" length_in_metric = %e, not invertible\n",dVar1);
                      ref_grid_local._4_4_ = 4;
                    }
                    else {
                      for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
                        ideal_location[local_124] =
                             (dVar2 / dVar1) * log_m0[(long)local_124 + 5] +
                             ideal_location[local_124];
                      }
                      ref_grid_local._4_4_ = 0;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x54b,"ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"exp avg");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x548,"ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"get n3 log m");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x547,"ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"get n2 log m");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x546,"ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"get n1 log m");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x545,"ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"get n0 log m");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x542,"ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"normalize direction");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x540,"ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"tri normal");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x52c,
           "ref_smooth_tet_ideal",(ulong)ref_grid_local._4_4_,"get tri");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_ideal(REF_GRID ref_grid, REF_INT node,
                                        REF_INT tet, REF_DBL *ideal_location) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_node, tri_node;
  REF_INT ixyz;
  REF_DBL dn[3];
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m3[6], log_m[6];
  REF_DBL m[6];
  REF_DBL scale, length_in_metric;
  REF_INT i;

  RSS(ref_cell_nodes(ref_cell, tet, nodes), "get tri");
  tri_nodes[0] = REF_EMPTY;
  tri_nodes[1] = REF_EMPTY;
  tri_nodes[2] = REF_EMPTY;
  for (tet_node = 0; tet_node < 4; tet_node++)
    if (node == nodes[tet_node]) {
      for (tri_node = 0; tri_node < 3; tri_node++)
        tri_nodes[tri_node] =
            nodes[ref_cell_f2n_gen(ref_cell, tri_node, tet_node)];
    }
  if (tri_nodes[0] == REF_EMPTY || tri_nodes[1] == REF_EMPTY ||
      tri_nodes[2] == REF_EMPTY)
    THROW("empty tetrahedra face");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = (ref_node_xyz(ref_node, ixyz, tri_nodes[0]) +
                            ref_node_xyz(ref_node, ixyz, tri_nodes[1]) +
                            ref_node_xyz(ref_node, ixyz, tri_nodes[2])) /
                           3.0;

  RSS(ref_node_tri_normal(ref_node, tri_nodes, dn), "tri normal");

  RSS(ref_math_normalize(dn), "normalize direction");

  /* averaged metric */
  RSS(ref_node_metric_get_log(ref_node, nodes[0], log_m0), "get n0 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], log_m1), "get n1 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], log_m2), "get n2 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[3], log_m3), "get n3 log m");
  for (i = 0; i < 6; i++)
    log_m[i] = (log_m0[i] + log_m1[i] + log_m2[i] + log_m3[i]) * 0.25;
  RSS(ref_matrix_exp_m(log_m, m), "exp avg");

  length_in_metric = ref_matrix_sqrt_vt_m_v(m, dn);

  scale = sqrt(6.0) / 3.0; /* altitude of regular tetrahedra */
  if (ref_math_divisible(scale, length_in_metric)) {
    scale = scale / length_in_metric;
  } else {
    printf(" length_in_metric = %e, not invertible\n", length_in_metric);
    return REF_DIV_ZERO;
  }

  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] += scale * dn[ixyz];

  return REF_SUCCESS;
}